

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.h
# Opt level: O0

Vec3 __thiscall cert::World::light_hit(World *this,Vec3 point,Vec3 normal)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  Light **ppLVar5;
  undefined4 extraout_var;
  Vec3 VVar6;
  Ray local_a8;
  Vec3 local_90;
  Vec3 local_7c;
  float local_70;
  undefined1 auStack_6c [4];
  float distance;
  LightRayRecord rec;
  int i;
  World *this_local;
  undefined8 local_3c;
  Vec3 normal_local;
  undefined1 local_20 [8];
  Vec3 point_local;
  Vec3 attenuation;
  
  normal_local.x = normal.z;
  local_3c = normal._0_8_;
  point_local.x = point.z;
  normal_local._4_8_ = point._0_8_;
  point_local.y = 0.0;
  point_local.z = 0.0;
  unique0x10000184 = this;
  local_20 = (undefined1  [8])normal_local._4_8_;
  for (rec.attenuation.y = 0.0; uVar3 = (ulong)(int)rec.attenuation.y,
      sVar4 = DynamicArray<cert::Light_*>::size(&this->lights), uVar3 < sVar4;
      rec.attenuation.y = (float)((int)rec.attenuation.y + 1)) {
    ppLVar5 = DynamicArray<cert::Light_*>::at(&this->lights,(long)(int)rec.attenuation.y);
    uVar2 = (*(*ppLVar5)->_vptr_Light[2])(*ppLVar5,local_20,&local_3c);
    _auStack_6c = CONCAT44(extraout_var,uVar2);
    if ((uVar2 & 1) != 0) {
      ppLVar5 = DynamicArray<cert::Light_*>::at(&this->lights,(long)(int)rec.attenuation.y);
      VVar6 = operator-(&(*ppLVar5)->position,(Vec3 *)local_20);
      local_90._0_8_ = VVar6._0_8_;
      local_7c.x = local_90.x;
      local_7c.y = local_90.y;
      local_90.z = VVar6.z;
      local_7c.z = local_90.z;
      local_90 = VVar6;
      local_70 = Vec3::length(&local_7c);
      ppLVar5 = DynamicArray<cert::Light_*>::at(&this->lights,(long)(int)rec.attenuation.y);
      Light::ray_to_light(&local_a8,*ppLVar5,(Vec3 *)local_20);
      bVar1 = intersects(this,&local_a8,0.001,local_70);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        Vec3::operator+=((Vec3 *)&point_local.y,(Vec3 *)&distance);
      }
    }
  }
  VVar6.z = 0.0;
  VVar6.x = point_local.y;
  VVar6.y = point_local.z;
  return VVar6;
}

Assistant:

constexpr Vec3 light_hit (Vec3 point, Vec3 normal) const
	{
		Vec3 attenuation = VEC3_ZERO;
		for (int i = 0; i < lights.size (); i++)
		{
			auto rec = lights.at (i)->visible (point, normal);
			if (rec.visible)
			{
				float distance = (lights.at (i)->position - point).length ();
				if (!intersects (lights.at (i)->ray_to_light (point), 0.001, distance))
				{
					attenuation += rec.attenuation;
				}
			}
		}
		return attenuation;
	}